

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_threadpool.cpp
# Opt level: O0

string_view __thiscall
cls_static_func::cls_static_tn_callbackstr(cls_static_func *this,int n,string_view str)

{
  string_view sVar1;
  bool bVar2;
  log_level lVar3;
  Logger *pLVar4;
  undefined4 in_register_00000034;
  id local_40;
  longlong local_38;
  longlong tid;
  size_t sStack_28;
  int n_local;
  string_view str_local;
  
  sStack_28 = CONCAT44(in_register_00000034,n);
  str_local._M_len = str._M_len;
  tid._4_4_ = SUB84(this,0);
  local_40 = std::this_thread::get_id();
  local_38 = tid_to_ll(&local_40);
  pLVar4 = Logger::get_instance();
  bVar2 = Logger::is_inited(pLVar4);
  if ((!bVar2) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","cls_static_tn_callbackstr",
           0x3b);
  }
  lVar3 = Logger::get_log_level();
  if (1 < (int)lVar3) {
    pLVar4 = Logger::get_instance();
    Logger::write_log(pLVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/threadpool/tests/test_threadpool.cpp"
                      ,"cls_static_tn_callbackstr",0x3b,LOG_LEVEL_INFO,
                      "[tid:%lld]  hello, cls_static_tn_callbackstr !\n",local_38);
    pLVar4 = Logger::get_instance();
    Logger::flush(pLVar4);
  }
  sVar1._M_str = (char *)str_local._M_len;
  sVar1._M_len = sStack_28;
  return sVar1;
}

Assistant:

static string_view cls_static_tn_callbackstr(int n, string_view str) {
        long long tid = tid_to_ll(this_thread::get_id()); 
        LOG_INFO("[tid:%lld]  hello, cls_static_tn_callbackstr !\n", tid);
		return str;
	}